

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15PrivateEnums.cpp
# Opt level: O1

ENUM__morph_method_enum
COLLADASaxFWL15::toEnum_ENUM__morph_method_enum
          (ParserChar **buffer,ParserChar *bufferEnd,bool *failed,
          pair<unsigned_long,_COLLADASaxFWL15::ENUM__morph_method_enum> *enumMap,
          _func_StringHash_ParserChar_ptr_ptr_ParserChar_ptr_bool_ptr *baseConversionFunc)

{
  StringHash SVar1;
  ENUM__morph_method_enum EVar2;
  StringHash SVar3;
  StringHash SVar4;
  long lVar5;
  bool bVar6;
  
  SVar3 = (*baseConversionFunc)(buffer,bufferEnd,failed);
  lVar5 = 0;
  bVar6 = false;
  SVar4 = SVar3;
  do {
    SVar1 = *(StringHash *)((long)&enumMap->first + lVar5);
    if (SVar1 == SVar3) {
      *failed = false;
      SVar4 = (StringHash)*(uint *)((long)&enumMap->second + lVar5);
    }
    EVar2 = (ENUM__morph_method_enum)SVar4;
    if (SVar1 == SVar3) break;
    lVar5 = lVar5 + 0x10;
    bVar6 = lVar5 != 0x10;
  } while (lVar5 == 0x10);
  if (bVar6) {
    *failed = true;
    EVar2 = ENUM__morph_method_enum__COUNT;
  }
  return EVar2;
}

Assistant:

ENUM__morph_method_enum toEnum_ENUM__morph_method_enum (
    const ParserChar** buffer,
    const ParserChar* bufferEnd,
    bool& failed,
    const std::pair<StringHash, ENUM__morph_method_enum>* enumMap,
    StringHash (*baseConversionFunc)( const ParserChar**, const ParserChar*, bool& )
)
{
    return Utils::toEnum<ENUM__morph_method_enum, StringHash, ENUM__morph_method_enum__COUNT>(buffer, bufferEnd, failed, enumMap, baseConversionFunc);
}